

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

BZFILE * BZ2_bzWriteOpen(int *bzerror,FILE *f,int blockSize100k,int verbosity,int workFactor)

{
  int iVar1;
  undefined8 *__ptr;
  
  if (bzerror != (int *)0x0) {
    *bzerror = 0;
  }
  if (((((uint)verbosity < 5) && (f != (FILE *)0x0)) && (0xfffffff6 < blockSize100k - 10U)) &&
     ((uint)workFactor < 0xfb)) {
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      __ptr = (undefined8 *)malloc(0x13f0);
      if (__ptr == (undefined8 *)0x0) {
        if (bzerror != (int *)0x0) {
          *bzerror = -3;
        }
      }
      else {
        if (bzerror != (int *)0x0) {
          *bzerror = 0;
        }
        *(undefined4 *)(__ptr + 0x27d) = 0;
        *(undefined1 *)((long)__ptr + 0x13ec) = 0;
        *(undefined4 *)(__ptr + 0x272) = 0;
        *__ptr = f;
        iVar1 = 0x1e;
        if (workFactor != 0) {
          iVar1 = workFactor;
        }
        *(undefined1 *)((long)__ptr + 0x1394) = 1;
        __ptr[0x27a] = 0;
        __ptr[0x27b] = 0;
        __ptr[0x27c] = 0;
        iVar1 = BZ2_bzCompressInit((bz_stream *)(__ptr + 0x273),blockSize100k,verbosity,iVar1);
        if (iVar1 == 0) {
          *(undefined4 *)(__ptr + 0x274) = 0;
          *(undefined1 *)((long)__ptr + 0x13ec) = 1;
          return __ptr;
        }
        if (bzerror != (int *)0x0) {
          *bzerror = iVar1;
        }
        *(int *)(__ptr + 0x27d) = iVar1;
        free(__ptr);
      }
    }
    else if (bzerror != (int *)0x0) {
      *bzerror = -6;
    }
  }
  else if (bzerror != (int *)0x0) {
    *bzerror = -2;
  }
  return (BZFILE *)0x0;
}

Assistant:

BZFILE* BZ_API(BZ2_bzWriteOpen)
                    ( int*  bzerror,
                      FILE* f,
                      int   blockSize100k,
                      int   verbosity,
                      int   workFactor )
{
   Int32   ret;
   bzFile* bzf = NULL;

   BZ_SETERR(BZ_OK);

   if (f == NULL ||
       (blockSize100k < 1 || blockSize100k > 9) ||
       (workFactor < 0 || workFactor > 250) ||
       (verbosity < 0 || verbosity > 4))
      { BZ_SETERR(BZ_PARAM_ERROR); return NULL; };

   if (ferror(f))
      { BZ_SETERR(BZ_IO_ERROR); return NULL; };

   bzf = malloc ( sizeof(bzFile) );
   if (bzf == NULL)
      { BZ_SETERR(BZ_MEM_ERROR); return NULL; };

   BZ_SETERR(BZ_OK);
   bzf->initialisedOk = False;
   bzf->bufN          = 0;
   bzf->handle        = f;
   bzf->writing       = True;
   bzf->strm.bzalloc  = NULL;
   bzf->strm.bzfree   = NULL;
   bzf->strm.opaque   = NULL;

   if (workFactor == 0) workFactor = 30;
   ret = BZ2_bzCompressInit ( &(bzf->strm), blockSize100k,
                              verbosity, workFactor );
   if (ret != BZ_OK)
      { BZ_SETERR(ret); free(bzf); return NULL; };

   bzf->strm.avail_in = 0;
   bzf->initialisedOk = True;
   return bzf;
}